

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O3

Status __thiscall
leveldb::SetCurrentFile(leveldb *this,Env *env,string *dbname,uint64_t descriptor_number)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined1 *puVar3;
  _Alloc_hider _Var4;
  leveldb *plVar5;
  _Alloc_hider __s1;
  int iVar6;
  long *plVar7;
  size_type *psVar8;
  ulong uVar9;
  string tmp;
  Status *s;
  string manifest;
  string local_d0;
  leveldb *local_b0;
  string local_a8;
  void *local_88;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  string local_60;
  Slice local_40;
  
  local_b0 = this;
  DescriptorFileName(&local_60,dbname,descriptor_number);
  __s1._M_p = local_60._M_dataplus._M_p;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  pcVar2 = (dbname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar2,pcVar2 + dbname->_M_string_length);
  std::__cxx11::string::append((char *)&local_d0);
  _Var4._M_p = local_d0._M_dataplus._M_p;
  if (local_60._M_string_length < local_d0._M_string_length) {
LAB_00106b9f:
    __assert_fail("contents.starts_with(dbname + \"/\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/filename.cc"
                  ,0x80,"Status leveldb::SetCurrentFile(Env *, const std::string &, uint64_t)");
  }
  iVar6 = bcmp(__s1._M_p,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  if (iVar6 != 0) goto LAB_00106b9f;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_p != &local_d0.field_2) {
    operator_delete(_Var4._M_p);
  }
  uVar9 = dbname->_M_string_length + 1;
  if (local_60._M_string_length < uVar9) {
    __assert_fail("n <= size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/include/leveldb/slice.h"
                  ,0x46,"void leveldb::Slice::remove_prefix(size_t)");
  }
  TempFileName(&local_d0,dbname,descriptor_number);
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_80,__s1._M_p + uVar9,__s1._M_p + local_60._M_string_length);
  plVar7 = (long *)std::__cxx11::string::append((char *)local_80);
  plVar5 = local_b0;
  paVar1 = &local_a8.field_2;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_a8.field_2._M_allocated_capacity = *psVar8;
    local_a8.field_2._8_8_ = plVar7[3];
    local_a8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a8.field_2._M_allocated_capacity = *psVar8;
    local_a8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_a8._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_40.data_ = local_a8._M_dataplus._M_p;
  local_40.size_ = local_a8._M_string_length;
  WriteStringToFileSync(local_b0,env,&local_40,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
  }
  if (*(long *)plVar5 == 0) {
    CurrentFileName(&local_a8,dbname);
    (*env->_vptr_Env[0xc])(local_80,env,&local_d0,&local_a8);
    puVar3 = *(undefined1 **)plVar5;
    *(undefined1 **)plVar5 = local_80[0];
    local_80[0] = puVar3;
    if (puVar3 != (undefined1 *)0x0) {
      operator_delete__(puVar3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if (*(long *)plVar5 == 0) goto LAB_00106b60;
  }
  (*env->_vptr_Env[8])(&local_88,env,&local_d0);
  if (local_88 != (void *)0x0) {
    operator_delete__(local_88);
  }
LAB_00106b60:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return (Status)(char *)plVar5;
}

Assistant:

Status SetCurrentFile(Env* env, const std::string& dbname,
                      uint64_t descriptor_number) {
  // Remove leading "dbname/" and add newline to manifest file name
  std::string manifest = DescriptorFileName(dbname, descriptor_number);
  Slice contents = manifest;
  assert(contents.starts_with(dbname + "/"));
  contents.remove_prefix(dbname.size() + 1);
  std::string tmp = TempFileName(dbname, descriptor_number);
  Status s = WriteStringToFileSync(env, contents.ToString() + "\n", tmp);
  if (s.ok()) {
    s = env->RenameFile(tmp, CurrentFileName(dbname));
  }
  if (!s.ok()) {
    env->DeleteFile(tmp);
  }
  return s;
}